

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathExtras.h
# Opt level: O0

unsigned_short llvm::reverseBits<unsigned_short>(unsigned_short Val)

{
  uint local_14;
  undefined2 local_e;
  uint i;
  uchar out [2];
  uchar in [2];
  unsigned_short Val_local;
  
  i._0_2_ = Val;
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    *(undefined1 *)((long)&local_e + (1 - (ulong)local_14)) =
         BitReverseTable256[*(byte *)((long)&i + (ulong)local_14)];
  }
  return local_e;
}

Assistant:

T reverseBits(T Val) {
  unsigned char in[sizeof(Val)];
  unsigned char out[sizeof(Val)];
  std::memcpy(in, &Val, sizeof(Val));
  for (unsigned i = 0; i < sizeof(Val); ++i)
    out[(sizeof(Val) - i) - 1] = BitReverseTable256[in[i]];
  std::memcpy(&Val, out, sizeof(Val));
  return Val;
}